

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_save_select_show_hash_option.hpp
# Opt level: O0

void __thiscall
PatchSaveSelectShowHashOption::alter_rom(PatchSaveSelectShowHashOption *this,ROM *rom)

{
  ROM *pRVar1;
  size_type sVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_80;
  allocator<char> local_51;
  string local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  ROM *local_18;
  ROM *rom_local;
  PatchSaveSelectShowHashOption *this_local;
  
  local_18 = rom;
  rom_local = (ROM *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Hash",&local_51);
  Symbols::bytes_for_symbols(&local_30,&local_50);
  md::ROM::set_bytes(rom,0x29a20,&local_30);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  md::ROM::set_word(local_18,0x29a4b,0x100);
  md::ROM::set_word(local_18,0x294e8,0xffff);
  pRVar1 = local_18;
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (&this->_hash_sentence);
  md::ROM::set_byte(pRVar1,0x29a4d,(uint8_t)sVar2);
  pRVar1 = local_18;
  Symbols::bytes_for_symbols(&local_80,&this->_hash_sentence);
  md::ROM::set_bytes(pRVar1,0x29a4e,&local_80);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_80);
  return;
}

Assistant:

void alter_rom(md::ROM& rom)
    {
        // Replace "Copy" string by "Hash"
        rom.set_bytes(0x29A20, Symbols::bytes_for_symbols("Hash"));

        // Replace "Massan" by an empty string, and make this string the one shown for every map in the game
        rom.set_word(0x29A4B, 0x0100);
        rom.set_word(0x294E8, 0xFFFF);

        // Put hash sentence as string 4D
        rom.set_byte(0x29A4D, (uint8_t)_hash_sentence.size());
        rom.set_bytes(0x29A4E, Symbols::bytes_for_symbols(_hash_sentence));
    }